

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O3

int op_fetch_headers(OggOpusFile *_of,OpusHead *_head,OpusTags *_tags,ogg_uint32_t **_serialnos,
                    int *_nserialnos,int *_cserialnos,ogg_page *_og)

{
  ulong uVar1;
  ogg_stream_state *poVar2;
  int iVar3;
  ogg_uint32_t oVar4;
  undefined4 uVar5;
  int iVar6;
  opus_int64 oVar7;
  ogg_uint32_t *poVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ogg_page og;
  uchar *local_80;
  size_t local_78;
  ogg_page local_50;
  
  if (_og == (ogg_page *)0x0) {
    lVar11 = _of->offset;
    if (0x7ffffffffffefffe < lVar11) {
      lVar11 = 0x7ffffffffffeffff;
    }
    _og = &local_50;
    oVar7 = op_get_next_page(_of,_og,lVar11 + 0x10000);
    if (oVar7 < 0) {
      return -0x84;
    }
  }
  _of->ready_state = 2;
  if (_serialnos != (ogg_uint32_t **)0x0) {
    *_nserialnos = 0;
  }
  poVar2 = &_of->os;
  do {
    iVar3 = ogg_page_bos(_og);
    if (iVar3 == 0) {
      if (_of->ready_state == 3) {
        lVar11 = (_of->os).serialno;
        iVar3 = ogg_page_serialno(_og);
        if (lVar11 != iVar3) goto LAB_00105b7c;
        while( true ) {
          ogg_stream_pagein(poVar2,_og);
LAB_00105b7c:
          iVar6 = ogg_stream_packetout(poVar2,&local_80);
          iVar9 = -0x85;
          iVar3 = iVar9;
          if (iVar6 != 0) break;
          while( true ) {
            lVar11 = _of->offset;
            if (0x7ffffffffffefffe < lVar11) {
              lVar11 = 0x7ffffffffffeffff;
            }
            oVar7 = op_get_next_page(_of,_og,lVar11 + 0x10000);
            if (oVar7 < 0) goto LAB_00105bde;
            lVar11 = (_of->os).serialno;
            iVar6 = ogg_page_serialno(_og);
            if (lVar11 == iVar6) break;
            iVar6 = ogg_page_bos(_og);
            if (iVar6 != 0) goto LAB_00105bde;
          }
        }
        if ((iVar6 != -1) && (iVar3 = opus_tags_parse(_tags,local_80,local_78), -1 < iVar3)) {
          iVar3 = ogg_stream_packetout(poVar2,&local_80);
          if ((iVar3 == 0) && (_og->header[_og->header_len + -1] != 0xff)) {
            return 0;
          }
          opus_tags_clear(_tags);
          iVar3 = iVar9;
        }
      }
      else {
        iVar3 = -0x84;
      }
      goto LAB_00105bde;
    }
    if (_serialnos != (ogg_uint32_t **)0x0) {
      poVar8 = *_serialnos;
      uVar12 = (ulong)*_nserialnos;
      oVar4 = ogg_page_serialno(_og);
      if (0 < (long)uVar12) {
        iVar3 = -0x85;
        if (*poVar8 == oVar4) goto LAB_00105bde;
        uVar10 = 0;
        do {
          if (uVar12 - 1 == uVar10) goto LAB_00105a31;
          uVar1 = uVar10 + 1;
          lVar11 = uVar10 + 1;
          uVar10 = uVar1;
        } while (poVar8[lVar11] != oVar4);
        if (uVar1 < uVar12) goto LAB_00105bde;
      }
LAB_00105a31:
      oVar4 = ogg_page_serialno(_og);
      poVar8 = *_serialnos;
      iVar6 = *_nserialnos;
      iVar9 = *_cserialnos;
      if (iVar9 <= iVar6) {
        iVar3 = -0x81;
        if ((0xfffffff < iVar9) ||
           (poVar8 = (ogg_uint32_t *)realloc(poVar8,(long)iVar9 * 8 + 4),
           poVar8 == (ogg_uint32_t *)0x0)) goto LAB_00105bde;
        iVar9 = iVar9 * 2 + 1;
      }
      poVar8[iVar6] = oVar4;
      *_serialnos = poVar8;
      *_nserialnos = iVar6 + 1;
      *_cserialnos = iVar9;
    }
    if (_of->ready_state < 3) {
      uVar5 = ogg_page_serialno(_og);
      ogg_stream_reset_serialno(poVar2,uVar5);
      ogg_stream_pagein(poVar2,_og);
      iVar3 = ogg_stream_packetout(poVar2,&local_80);
      if (0 < iVar3) {
        iVar3 = opus_head_parse(_head,local_80,local_78);
        if (iVar3 < 0) {
          if (iVar3 != -0x84) goto LAB_00105bde;
        }
        else {
          _of->ready_state = 3;
        }
      }
    }
    lVar11 = _of->offset;
    if (0x7ffffffffffefffe < lVar11) {
      lVar11 = 0x7ffffffffffeffff;
    }
    oVar7 = op_get_next_page(_of,_og,lVar11 + 0x10000);
  } while (-1 < oVar7);
  iVar3 = (_of->ready_state < 3) - 0x85;
LAB_00105bde:
  _of->ready_state = 2;
  return iVar3;
}

Assistant:

static int op_fetch_headers(OggOpusFile *_of,OpusHead *_head,
 OpusTags *_tags,ogg_uint32_t **_serialnos,int *_nserialnos,
 int *_cserialnos,ogg_page *_og){
  ogg_page og;
  int      ret;
  if(!_og){
    /*No need to clamp the boundary offset against _of->end, as all errors
       become OP_ENOTFORMAT.*/
    if(OP_UNLIKELY(op_get_next_page(_of,&og,
     OP_ADV_OFFSET(_of->offset,OP_CHUNK_SIZE))<0)){
      return OP_ENOTFORMAT;
    }
    _og=&og;
  }
  _of->ready_state=OP_OPENED;
  ret=op_fetch_headers_impl(_of,_head,_tags,_serialnos,_nserialnos,
   _cserialnos,_og);
  /*Revert back from OP_STREAMSET to OP_OPENED on failure, to prevent
     double-free of the tags in an unseekable stream.*/
  if(OP_UNLIKELY(ret<0))_of->ready_state=OP_OPENED;
  return ret;
}